

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Arg::parse_ushort_radix(char *str,int n,void *dest,int radix)

{
  bool bVar1;
  ulong local_38;
  unsigned_long r;
  undefined2 *puStack_28;
  int radix_local;
  void *dest_local;
  char *pcStack_18;
  int n_local;
  char *str_local;
  
  r._4_4_ = radix;
  puStack_28 = (undefined2 *)dest;
  dest_local._4_4_ = n;
  pcStack_18 = str;
  bVar1 = parse_ulong_radix(str,n,&local_38,radix);
  if (bVar1) {
    if ((local_38 & 0xffff) == local_38) {
      if (puStack_28 == (undefined2 *)0x0) {
        str_local._7_1_ = true;
      }
      else {
        *puStack_28 = (short)local_38;
        str_local._7_1_ = true;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool RE2::Arg::parse_ushort_radix(const char* str,
                                 int n,
                                 void* dest,
                                 int radix) {
  unsigned long r;
  if (!parse_ulong_radix(str, n, &r, radix)) return false; // Could not parse
  if ((ushort)r != r) return false;                      // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<unsigned short*>(dest)) = (ushort)r;
  return true;
}